

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  pointer pcVar6;
  bool bVar7;
  string local_58;
  ReusableStringStream local_38;
  SourceLineInfo local_28;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    normaliseString(&local_58,this,str);
    uVar5 = (this->m_pattern)._M_string_length;
    if (uVar5 == local_58._M_string_length) {
      if (uVar5 != 0) {
        pcVar6 = (this->m_pattern)._M_dataplus._M_p;
LAB_00141068:
        iVar3 = bcmp(pcVar6,local_58._M_dataplus._M_p,uVar5);
        bVar7 = iVar3 == 0;
        goto LAB_0014111b;
      }
LAB_00141139:
      bVar7 = true;
      goto LAB_0014111b;
    }
    break;
  case WildcardAtStart:
    normaliseString(&local_58,this,str);
    uVar5 = (this->m_pattern)._M_string_length;
    if (uVar5 <= local_58._M_string_length) {
      bVar7 = uVar5 == 0;
      if (bVar7) goto LAB_0014111b;
      pcVar6 = (this->m_pattern)._M_dataplus._M_p;
      if (pcVar6[uVar5 - 1] == local_58._M_dataplus._M_p[local_58._M_string_length - 1]) {
        lVar4 = 0;
        do {
          bVar7 = 1 - uVar5 == lVar4;
          if (bVar7) goto LAB_0014111b;
          lVar2 = lVar4 + (uVar5 - 2);
          lVar1 = lVar4 + (local_58._M_string_length - 2);
          lVar4 = lVar4 + -1;
        } while (pcVar6[lVar2] == local_58._M_dataplus._M_p[lVar1]);
      }
    }
    break;
  case WildcardAtEnd:
    normaliseString(&local_58,this,str);
    uVar5 = (this->m_pattern)._M_string_length;
    if (uVar5 <= local_58._M_string_length) {
      if (uVar5 != 0) {
        pcVar6 = (this->m_pattern)._M_dataplus._M_p;
        goto LAB_00141068;
      }
      goto LAB_00141139;
    }
    break;
  case WildcardAtBothEnds:
    normaliseString(&local_58,this,str);
    lVar4 = std::__cxx11::string::find
                      ((char *)&local_58,(ulong)(this->m_pattern)._M_dataplus._M_p,0);
    bVar7 = lVar4 != -1;
    goto LAB_0014111b;
  default:
    ReusableStringStream::ReusableStringStream(&local_38);
    local_28.file =
         "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
    ;
    local_28.line = 0x1dc0;
    operator<<(local_38.m_oss,&local_28);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_38.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_38.m_oss,"Unknown enum",0xc);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_58);
  }
  bVar7 = false;
LAB_0014111b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool WildcardPattern::matches( std::string const& str ) const {
        switch( m_wildcard ) {
            case NoWildcard:
                return m_pattern == normaliseString( str );
            case WildcardAtStart:
                return endsWith( normaliseString( str ), m_pattern );
            case WildcardAtEnd:
                return startsWith( normaliseString( str ), m_pattern );
            case WildcardAtBothEnds:
                return contains( normaliseString( str ), m_pattern );
            default:
                CATCH_INTERNAL_ERROR( "Unknown enum" );
        }
    }